

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileHdrWrapper.cpp
# Opt level: O0

void * __thiscall FileHdrWrapper::getFieldPtr(FileHdrWrapper *this,size_t fieldId,size_t subField)

{
  int iVar1;
  undefined4 extraout_var;
  IMAGE_FILE_HEADER *fileHeader;
  IMAGE_FILE_HEADER *hdr;
  size_t subField_local;
  size_t fieldId_local;
  FileHdrWrapper *this_local;
  
  iVar1 = (*(this->super_PEElementWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
            _vptr_AbstractByteBuffer[0xc])();
  this_local = (FileHdrWrapper *)CONCAT44(extraout_var,iVar1);
  if (this_local == (FileHdrWrapper *)0x0) {
    this_local = (FileHdrWrapper *)0x0;
  }
  else {
    switch(fieldId) {
    case 0:
      break;
    case 1:
      this_local = (FileHdrWrapper *)
                   ((long)&(this_local->super_PEElementWrapper).super_ExeElementWrapper.
                           super_AbstractByteBuffer._vptr_AbstractByteBuffer + 2);
      break;
    case 2:
      this_local = (FileHdrWrapper *)
                   ((long)&(this_local->super_PEElementWrapper).super_ExeElementWrapper.
                           super_AbstractByteBuffer._vptr_AbstractByteBuffer + 4);
      break;
    case 3:
      this_local = (FileHdrWrapper *)
                   &(this_local->super_PEElementWrapper).super_ExeElementWrapper.m_Exe;
      break;
    case 4:
      this_local = (FileHdrWrapper *)
                   ((long)&(this_local->super_PEElementWrapper).super_ExeElementWrapper.m_Exe + 4);
      break;
    case 5:
      this_local = (FileHdrWrapper *)&(this_local->super_PEElementWrapper).m_PE;
      break;
    case 6:
      this_local = (FileHdrWrapper *)((long)&(this_local->super_PEElementWrapper).m_PE + 2);
    }
  }
  return this_local;
}

Assistant:

void* FileHdrWrapper::getFieldPtr(size_t fieldId, size_t subField)
{
    IMAGE_FILE_HEADER * hdr = reinterpret_cast<IMAGE_FILE_HEADER*>(getPtr());
    if (!hdr) return NULL;

    IMAGE_FILE_HEADER &fileHeader = (*hdr);
    switch (fieldId) {
         case MACHINE: return (void*) &fileHeader.Machine;
         case SEC_NUM: return (void*) &fileHeader.NumberOfSections;
         case TIMESTAMP: return (void*) &fileHeader.TimeDateStamp;
         case SYMBOL_PTR: return (void*) &fileHeader.PointerToSymbolTable;
         case SYMBOL_NUM: return (void*) &fileHeader.NumberOfSymbols;
         case OPTHDR_SIZE: return (void*) &fileHeader.SizeOfOptionalHeader;
         case CHARACT: return (void*) &fileHeader.Characteristics;
    }
    return (void*) &fileHeader;
}